

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O2

pboolean p_socket_check_connect_result(PSocket *socket,PError **error)

{
  byte bVar1;
  int iVar2;
  pint pVar3;
  PErrorIO PVar4;
  uint uVar5;
  pint val;
  socklen_t optlen;
  
  if (socket == (PSocket *)0x0) {
    uVar5 = 0;
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
  }
  else {
    optlen = 4;
    uVar5 = 1;
    iVar2 = getsockopt(socket->fd,1,4,&val,&optlen);
    if (iVar2 < 0) {
      pVar3 = p_error_get_last_net();
      PVar4 = p_error_get_io_from_system(pVar3);
      pVar3 = p_error_get_last_net();
      p_error_set_error_p(error,PVar4,pVar3,"Failed to call getsockopt() to get connection status");
      uVar5 = 0;
    }
    else {
      bVar1 = 8;
      if (val != 0) {
        PVar4 = p_error_get_io_from_system(val);
        p_error_set_error_p(error,PVar4,val,"Error in socket layer");
        uVar5 = (uint)(val == 0);
        bVar1 = (val == 0) << 3;
      }
      socket->field_0x18 = socket->field_0x18 & 0xf7 | bVar1;
    }
  }
  return uVar5;
}

Assistant:

P_LIB_API pboolean
p_socket_check_connect_result (PSocket  *socket,
			       PError	**error)
{
	socklen_t	optlen;
	pint		val;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	optlen = sizeof (val);

	if (P_UNLIKELY (getsockopt (socket->fd, SOL_SOCKET, SO_ERROR, (ppointer) &val, &optlen) < 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call getsockopt() to get connection status");
		return FALSE;
	}

	if (P_UNLIKELY (val != 0))
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (val),
				     val,
				     "Error in socket layer");

	socket->connected = (val == 0);

	return (val == 0);
}